

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-death.c
# Opt level: O2

void death_examine(char *title,wchar_t row)

{
  _Bool _Var1;
  textblock *tb;
  object *obj;
  char header [120];
  
  while( true ) {
    _Var1 = get_item(&obj,"Examine which item? ","You have nothing to examine.",CMD_NULL,
                     (item_tester)0x0,L'\x1b');
    if (!_Var1) break;
    tb = object_info(obj,OINFO_NONE);
    object_desc(header,0x78,obj,0xc3,player);
    textui_textblock_show(tb,(region_conflict)ZEXT816(0),header);
    textblock_free(tb);
  }
  return;
}

Assistant:

static void death_examine(const char *title, int row)
{
	struct object *obj;
	const char *q, *s;

	/* Get an item */
	q = "Examine which item? ";
	s = "You have nothing to examine.";

	while (get_item(&obj, q, s, 0, NULL, (USE_INVEN | USE_QUIVER | USE_EQUIP | IS_HARMLESS))) {
		char header[120];

		textblock *tb;
		region area = { 0, 0, 0, 0 };

		tb = object_info(obj, OINFO_NONE);
		object_desc(header, sizeof(header), obj,
			ODESC_PREFIX | ODESC_FULL | ODESC_CAPITAL, player);

		textui_textblock_show(tb, area, header);
		textblock_free(tb);
	}
}